

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_hdr_meta.c
# Opt level: O3

void fill_hdr_meta_to_frame(MppFrame frame,MppCodingType in_type)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  MppFrameContentLightMetadata MVar12;
  RK_U32 RVar13;
  RK_U32 RVar14;
  MppFrameColorTransferCharacteristic MVar15;
  MppFrameColorSpace MVar16;
  MppFrameColorPrimaries MVar17;
  size_t sVar18;
  MppBuffer buffer;
  void *pvVar19;
  MppFrameHdrDynamicMeta *pMVar20;
  MppMeta meta;
  uint uVar21;
  ulong uVar22;
  ushort uVar23;
  undefined2 uVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  undefined1 auVar28 [16];
  MppFrameMasteringDisplayMetadata mastering_display;
  MppFrameMasteringDisplayMetadata local_48;
  
  sVar18 = mpp_frame_get_buf_size(frame);
  uVar21 = (uint)sVar18;
  buffer = mpp_frame_get_buffer(frame);
  pvVar19 = mpp_buffer_get_ptr_with_caller(buffer,"fill_hdr_meta_to_frame");
  pMVar20 = mpp_frame_get_hdr_dynamic_meta(frame);
  mpp_frame_get_mastering_display(&local_48,frame);
  MVar12 = mpp_frame_get_content_light(frame);
  sVar18 = mpp_buffer_get_size_with_caller(buffer,"fill_hdr_meta_to_frame");
  if (buffer == (MppBuffer)0x0 || pvVar19 == (void *)0x0) {
    _mpp_log_l(2,(char *)0x0,"buf is null!\n","fill_hdr_meta_to_frame");
    return;
  }
  RVar13 = mpp_frame_get_thumbnail_en(frame);
  if (RVar13 == 2) {
    RVar13 = mpp_frame_get_width(frame);
    RVar14 = mpp_frame_get_height(frame);
    uVar21 = (RVar14 >> 1) * (RVar13 >> 1) * 3 >> 1;
  }
  uVar21 = uVar21 + 0xfff & 0xfffff000;
  uVar22 = (ulong)uVar21;
  if (pMVar20 == (MppFrameHdrDynamicMeta *)0x0) {
    iVar27 = 0;
  }
  else {
    iVar27 = pMVar20->size + 0x20;
    if (pMVar20->size == 0) {
      iVar27 = 0;
    }
  }
  if ((uint)sVar18 < iVar27 + uVar21 + 0x6c) {
    _mpp_log_l(2,(char *)0x0,"fill hdr meta overflow off %d size %d max %d\n",
               "fill_hdr_meta_to_frame",(ulong)uVar21,(ulong)(iVar27 + 0x6cU),(uint)sVar18);
    return;
  }
  meta = mpp_frame_get_meta(frame);
  mpp_meta_set_s32(meta,KEY_HDR_META_OFFSET,uVar21);
  *(undefined4 *)((long)pvVar19 + uVar22) = 0x6c013e;
  *(undefined2 *)((long)pvVar19 + uVar22 + 6) = 0;
  iVar26 = -1;
  if ((int)in_type < 0x1000007) {
    if (in_type == MPP_VIDEO_CodingAVC) {
      iVar26 = 2;
    }
    else {
      bVar3 = false;
      if (in_type != MPP_VIDEO_CodingHEVC) goto LAB_0013bb12;
      iVar26 = 1;
    }
  }
  else if (in_type == MPP_VIDEO_CodingAV1) {
    iVar26 = 3;
  }
  else {
    bVar3 = false;
    if (in_type != MPP_VIDEO_CodingAVS2) goto LAB_0013bb12;
    iVar26 = 0;
  }
  bVar3 = true;
LAB_0013bb12:
  *(undefined2 *)((long)pvVar19 + uVar22 + 0xc) = 0;
  *(short *)((long)pvVar19 + uVar22 + 0xe) = (short)iVar26;
  *(ulong *)((long)pvVar19 + uVar22 + 0x4c) =
       CONCAT44(local_48.max_luminance,local_48.min_luminance);
  auVar5._8_4_ = 0;
  auVar5._0_2_ = local_48.display_primaries[0][0];
  auVar5._2_2_ = local_48.display_primaries[0][1];
  auVar5._4_2_ = local_48.display_primaries[1][0];
  auVar5._6_2_ = local_48.display_primaries[1][1];
  auVar5._12_2_ = local_48.display_primaries[1][1];
  auVar7._8_2_ = local_48.display_primaries[1][0];
  auVar7._0_2_ = local_48.display_primaries[0][0];
  auVar7._2_2_ = local_48.display_primaries[0][1];
  auVar7._4_2_ = local_48.display_primaries[1][0];
  auVar7._6_2_ = local_48.display_primaries[1][1];
  auVar7._10_4_ = auVar5._10_4_;
  auVar10._6_8_ = 0;
  auVar10._0_6_ = auVar7._8_6_;
  auVar28._6_8_ = SUB148(auVar10 << 0x40,6);
  auVar28._4_2_ = local_48.display_primaries[0][1];
  auVar28._0_2_ = local_48.display_primaries[0][0];
  auVar28._2_2_ = 0;
  auVar28._14_2_ = 0;
  *(undefined1 (*) [16])((long)pvVar19 + uVar22 + 0x34) = auVar28;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = CONCAT44(local_48.white_point,local_48.display_primaries[2]);
  auVar4._12_2_ = local_48.white_point[1];
  auVar6._8_2_ = local_48.white_point[0];
  auVar6._0_8_ = CONCAT44(local_48.white_point,local_48.display_primaries[2]);
  auVar6._10_4_ = auVar4._10_4_;
  auVar11._6_8_ = 0;
  auVar11._0_6_ = auVar6._8_6_;
  auVar8._4_2_ = local_48.display_primaries[2][1];
  auVar8._0_2_ = local_48.display_primaries[2][0];
  auVar8._2_2_ = local_48.display_primaries[2][1];
  auVar8._6_8_ = SUB148(auVar11 << 0x40,6);
  auVar9._4_10_ = auVar8._4_10_;
  auVar9._0_4_ = (uint)local_48.display_primaries[2] & 0xffff;
  *(long *)((long)pvVar19 + uVar22 + 0x2c) = auVar9._0_8_;
  *(ulong *)((long)pvVar19 + uVar22 + 0x44) =
       (ulong)CONCAT24(local_48.white_point[1],local_48.white_point) & 0xffffffff0000ffff;
  MVar15 = mpp_frame_get_color_trc(frame);
  *(MppFrameColorTransferCharacteristic *)((long)pvVar19 + uVar22 + 0x28) = MVar15;
  MVar16 = mpp_frame_get_colorspace(frame);
  *(MppFrameColorSpace *)((long)pvVar19 + uVar22 + 0x20) = MVar16;
  MVar17 = mpp_frame_get_color_primaries(frame);
  *(MppFrameColorPrimaries *)((long)pvVar19 + uVar22 + 0x24) = MVar17;
  *(uint *)((long)pvVar19 + uVar22 + 0x54) = (uint)MVar12 & 0xffff;
  *(uint *)((long)pvVar19 + uVar22 + 0x58) = (uint)MVar12 >> 0x10;
  if (bVar3) {
    iVar1 = *(int *)((long)pvVar19 + uVar22 + 0x28);
    uVar23 = 2;
    if (iVar1 != *(int *)(&DAT_00152e04 + (long)iVar26 * 4)) {
      uVar23 = (ushort)(iVar1 == *(int *)(&DAT_00152df4 + (long)iVar26 * 4));
    }
  }
  else {
    uVar23 = 0;
  }
  uVar24 = 1;
  if ((pMVar20 != (MppFrameHdrDynamicMeta *)0x0) && (uVar2 = pMVar20->size, (ulong)uVar2 != 0)) {
    uVar25 = (ulong)(uVar21 + *(ushort *)((long)pvVar19 + uVar22 + 2));
    *(undefined2 *)((long)pvVar19 + uVar25) = 0x13e;
    *(short *)((long)pvVar19 + uVar25 + 2) = (short)iVar27;
    *(undefined2 *)((long)pvVar19 + uVar25 + 6) = 1;
    *(undefined2 *)((long)pvVar19 + uVar25 + 0xc) = 1;
    *(short *)((long)pvVar19 + uVar25 + 0xe) = (short)iVar26;
    uVar23 = (ushort)pMVar20->hdr_fmt;
    memcpy((void *)((long)pvVar19 + uVar25 + 0x20),pMVar20 + 1,(ulong)uVar2);
    *(undefined2 *)((long)pvVar19 + uVar25 + 4) = 2;
    *(ushort *)((long)pvVar19 + uVar25 + 10) = uVar23;
    uVar24 = 2;
  }
  mpp_meta_set_s32(meta,KEY_HDR_META_SIZE,iVar27 + 0x6cU);
  *(undefined2 *)((long)pvVar19 + uVar22 + 4) = uVar24;
  *(ushort *)((long)pvVar19 + uVar22 + 10) = uVar23;
  return;
}

Assistant:

void fill_hdr_meta_to_frame(MppFrame frame, MppCodingType in_type)
{
    RK_U32 off = hdr_get_offset_from_frame(frame);
    MppBuffer buf = mpp_frame_get_buffer(frame);
    void *ptr = mpp_buffer_get_ptr(buf);
    MppFrameHdrDynamicMeta *dynamic_meta = mpp_frame_get_hdr_dynamic_meta(frame);
    MppFrameMasteringDisplayMetadata mastering_display = mpp_frame_get_mastering_display(frame);
    MppFrameContentLightMetadata content_light = mpp_frame_get_content_light(frame);
    RkMetaHdrHeader *hdr_static_meta_header;
    RkMetaHdrHeader *hdr_dynamic_meta_header;
    RK_U32 msg_idx = 0;
    RK_U16 hdr_format = HDR_NONE;
    MppMeta meta = NULL;
    RK_U32 max_size = mpp_buffer_get_size(buf);
    RK_U32 static_size, dynamic_size = 0, total_size = 0;
    HdrCodecType codec_type = HDR_CODEC_UNSPECIFIED;

    if (!ptr || !buf) {
        mpp_err_f("buf is null!\n");
        return;
    }

    if (mpp_frame_get_thumbnail_en(frame) == MPP_FRAME_THUMBNAIL_ONLY) {
        // only for 8K thumbnail downscale to 4K 8bit mode
        RK_U32 downscale_width = mpp_frame_get_width(frame) / 2;
        RK_U32 downscale_height = mpp_frame_get_height(frame) / 2;

        off = downscale_width * downscale_height * 3 / 2;
    }
    off = MPP_ALIGN(off, SZ_4K);

    static_size = sizeof(RkMetaHdrHeader) + sizeof(HdrStaticMeta);
    if (dynamic_meta && dynamic_meta->size)
        dynamic_size = sizeof(RkMetaHdrHeader) + dynamic_meta->size;

    total_size = static_size + dynamic_size;

    if ((off + total_size) > max_size) {
        mpp_err_f("fill hdr meta overflow off %d size %d max %d\n",
                  off, total_size, max_size);
        return;
    }
    meta = mpp_frame_get_meta(frame);
    mpp_meta_set_s32(meta, KEY_HDR_META_OFFSET, off);
    /* 1. fill hdr static meta date */
    hdr_static_meta_header = (RkMetaHdrHeader*)(ptr + off);
    /* For transmission */
    hdr_static_meta_header->magic = HDR_META_MAGIC;
    hdr_static_meta_header->size = static_size;
    hdr_static_meta_header->message_index = msg_idx++;

    switch (in_type) {
    case MPP_VIDEO_CodingAVS2 : {
        codec_type = HDR_AVS2;
    } break;
    case MPP_VIDEO_CodingHEVC : {
        codec_type = HDR_HEVC;
    } break;
    case MPP_VIDEO_CodingAVC : {
        codec_type = HDR_H264;
    } break;
    case MPP_VIDEO_CodingAV1 : {
        codec_type = HDR_AV1;
    } break;
    default : break;
    }

    /* For payload identification */
    hdr_static_meta_header->hdr_payload_type = STATIC;
    hdr_static_meta_header->video_format = codec_type;
    {
        HdrStaticMeta *static_meta = (HdrStaticMeta*)hdr_static_meta_header->payload;

        static_meta->min_luminance = mastering_display.min_luminance;
        static_meta->max_luminance = mastering_display.max_luminance;
        static_meta->green_x = mastering_display.display_primaries[0][0];
        static_meta->green_y = mastering_display.display_primaries[0][1];
        static_meta->blue_x = mastering_display.display_primaries[1][0];
        static_meta->blue_y = mastering_display.display_primaries[1][1];
        static_meta->red_x = mastering_display.display_primaries[2][0];
        static_meta->red_y = mastering_display.display_primaries[2][1];
        static_meta->white_point_x = mastering_display.white_point[0];
        static_meta->white_point_y = mastering_display.white_point[1];
        static_meta->color_trc = mpp_frame_get_color_trc(frame);
        static_meta->color_space = mpp_frame_get_colorspace(frame);
        static_meta->color_primaries = mpp_frame_get_color_primaries(frame);
        static_meta->max_cll = content_light.MaxCLL;
        static_meta->max_fall = content_light.MaxFALL;
        /*
         * hlg:
         *  hevc trc = 18
         *  avs trc = 14
         * hdr10:
         *  hevc/h264 trc = 16
         *  avs trc = 12
         */
        switch (codec_type) {
        case HDR_AV1 :
        case HDR_HEVC :
        case HDR_H264 : {
            if (static_meta->color_trc == MPP_FRAME_TRC_ARIB_STD_B67)
                hdr_format = HLG;
            else if (static_meta->color_trc == MPP_FRAME_TRC_SMPTEST2084)
                hdr_format = HDR10;
        } break;
        case HDR_AVS2 : {
            if (static_meta->color_trc == MPP_FRAME_TRC_BT2020_10)
                hdr_format = HLG;
            else if (static_meta->color_trc == MPP_FRAME_TRC_BT1361_ECG)
                hdr_format = HDR10;
        } break;
        default : {
        } break;
        }
    }
    off += hdr_static_meta_header->size;

    /* 2. fill hdr dynamic meta date */
    if (dynamic_meta && dynamic_meta->size) {
        hdr_dynamic_meta_header = (RkMetaHdrHeader*)(ptr + off);

        /* For transmission */
        hdr_dynamic_meta_header->magic = HDR_META_MAGIC;
        hdr_dynamic_meta_header->size = dynamic_size;
        hdr_dynamic_meta_header->message_index = msg_idx++;

        /* For payload identification */
        hdr_dynamic_meta_header->hdr_payload_type = DYNAMIC;
        hdr_dynamic_meta_header->video_format = codec_type;
        hdr_format = dynamic_meta->hdr_fmt;

        memcpy(hdr_dynamic_meta_header->payload, dynamic_meta->data, dynamic_meta->size);
        hdr_dynamic_meta_header->message_total = msg_idx;
        hdr_dynamic_meta_header->hdr_format = hdr_format;
    }

    mpp_meta_set_s32(meta, KEY_HDR_META_SIZE, total_size);
    hdr_static_meta_header->message_total = msg_idx;
    hdr_static_meta_header->hdr_format = hdr_format;
}